

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

void __thiscall rapic::client::decode(client *this,mssg *msg)

{
  __int_type _Var1;
  type puVar2;
  client *in_RSI;
  long in_RDI;
  unsigned_long pos;
  size_t in_stack_ffffffffffffffc8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffd0;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffd8;
  client *pcVar3;
  undefined8 in_stack_ffffffffffffffe8;
  
  check_cur_type(in_RSI,(message_type)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  std::__cxx11::string::reserve((ulong)in_RSI);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffd8);
  if (*(ulong *)(in_RDI + 0xa8) < _Var1 % *(ulong *)(in_RDI + 0xa8) + *(long *)(in_RDI + 200)) {
    pcVar3 = in_RSI;
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RSI
                        ,in_stack_ffffffffffffffc8);
    std::__cxx11::string::assign((char *)in_RSI,(ulong)puVar2);
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RSI
                        ,in_stack_ffffffffffffffc8);
    std::__cxx11::string::append((char *)pcVar3,(ulong)puVar2);
  }
  else {
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       (in_stack_ffffffffffffffd0,(size_t)in_RSI);
    std::__cxx11::string::assign((char *)in_RSI,(ulong)puVar2);
  }
  return;
}

Assistant:

auto client::decode(mssg& msg) -> void
{
  check_cur_type(message_type::mssg);

  msg.content.reserve(cur_size_);

  // if the message spans the buffer wrap around point, copy it into a temporary location to ease parsing
  auto pos = rcount_ % capacity_;
  if (pos + cur_size_ > capacity_)
  {
    msg.content.assign(reinterpret_cast<char const*>(&buffer_[pos]), capacity_ - pos);
    msg.content.append(reinterpret_cast<char const*>(&buffer_[0]), cur_size_ - (capacity_ - pos));
  }
  else
  {
    msg.content.assign(reinterpret_cast<char const*>(&buffer_[pos]), cur_size_);
  }
}